

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

void __thiscall iqnet::ssl::exception::exception(exception *this,unsigned_long err)

{
  char *__s;
  allocator<char> local_9;
  
  *(undefined ***)this = &PTR__exception_0019e838;
  this->ssl_err = err;
  __s = ERR_reason_error_string(err);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->msg,__s,&local_9);
  std::__cxx11::string::insert((ulong)&this->msg,(char *)0x0);
  return;
}

Assistant:

exception::exception( unsigned long err ) throw():
  ssl_err(err),
  msg( ERR_reason_error_string(ssl_err) )
{
  msg.insert(0, "SSL: ");
}